

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.c
# Opt level: O2

size_t add_pair(pExecutor exec)

{
  int iVar1;
  size_t place;
  size_t local_10;
  
  iVar1 = find_place_for_pair(exec,&local_10);
  if (iVar1 == 2) {
    gc_collect(exec);
    iVar1 = find_place_for_pair(exec,&local_10);
    if (iVar1 == 2) {
      puts("add_pair: out of memory");
      return 0x7fffffff;
    }
  }
  exec->pairsFlags[local_10] = GC_USED;
  return local_10;
}

Assistant:

size_t add_pair(pExecutor exec)
{
    size_t place;
    int res = find_place_for_pair(exec, &place);
    if (res == FIND_PLACE_ERROR)
    {
        // free unused memory and try again
        gc_collect(exec);
        res = find_place_for_pair(exec, &place);
        if (res == FIND_PLACE_ERROR)
        {
            log("add_pair: out of memory");
            return EXPR_ERROR;
        }
    }
    exec->pairsFlags[place] = GC_USED;
    return place;
}